

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

int init_compatible_string_p(node_t_conflict n,type *el_type)

{
  basic_type bVar1;
  int iVar2;
  basic_type bVar3;
  bool local_21;
  bool local_19;
  type *el_type_local;
  node_t_conflict n_local;
  
  if (n->code == N_STR) {
    iVar2 = char_type_p(el_type);
    local_19 = true;
    if (iVar2 != 0) goto LAB_00190a57;
  }
  if ((n->code == N_STR16) && (el_type->mode == TM_BASIC)) {
    bVar1 = (el_type->u).basic_type;
    bVar3 = get_uint_basic_type(2);
    local_19 = true;
    if (bVar1 == bVar3) goto LAB_00190a57;
  }
  local_21 = false;
  if ((n->code == N_STR32) && (local_21 = false, el_type->mode == TM_BASIC)) {
    bVar1 = (el_type->u).basic_type;
    bVar3 = get_uint_basic_type(4);
    local_21 = bVar1 == bVar3;
  }
  local_19 = local_21;
LAB_00190a57:
  return (int)local_19;
}

Assistant:

static int init_compatible_string_p (node_t n, struct type *el_type) {
  return ((n->code == N_STR && char_type_p (el_type))
          || (n->code == N_STR16 && el_type->mode == TM_BASIC
              && el_type->u.basic_type == get_uint_basic_type (2))
          || (n->code == N_STR32 && el_type->mode == TM_BASIC
              && el_type->u.basic_type == get_uint_basic_type (4)));
}